

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.cxx
# Opt level: O0

ObjectErrorGenerator *
JsonErrors::INVALID_NAMED_OBJECT
          (ObjectErrorGenerator *__return_storage_ptr__,
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_Json::Value_*,_cmJSONState_*)>
          *nameGenerator)

{
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_Json::Value_*,_cmJSONState_*)>
  local_38;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_Json::Value_*,_cmJSONState_*)>
  *local_18;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_Json::Value_*,_cmJSONState_*)>
  *nameGenerator_local;
  
  local_18 = nameGenerator;
  nameGenerator_local =
       (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_Json::Value_*,_cmJSONState_*)>
        *)__return_storage_ptr__;
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_Json::Value_*,_cmJSONState_*)>
  ::function(&local_38,nameGenerator);
  std::
  function<std::function<void(Json::Value_const*,cmJSONState*)>(JsonErrors::ObjectError,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>
  ::
  function<JsonErrors::INVALID_NAMED_OBJECT(std::function<std::__cxx11::string(Json::Value_const*,cmJSONState*)>const&)::__0,void>
            ((function<std::function<void(Json::Value_const*,cmJSONState*)>(JsonErrors::ObjectError,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>
              *)__return_storage_ptr__,(anon_class_32_1_a6824aa8 *)&local_38);
  INVALID_NAMED_OBJECT(std::function<std::__cxx11::string(Json::Value_const*,cmJSONState*)>const&)::
  $_0::~__0((__0 *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

ObjectErrorGenerator INVALID_NAMED_OBJECT(
  const std::function<std::string(const Json::Value*, cmJSONState*)>&
    nameGenerator)
{
  return [nameGenerator](
           ObjectError errorType,
           const Json::Value::Members& extraFields) -> ErrorGenerator {
    return [nameGenerator, errorType, extraFields](
             const Json::Value* value, cmJSONState* state) -> void {
      std::string name = nameGenerator(value, state);
      switch (errorType) {
        case ObjectError::RequiredMissing:
          state->AddErrorAtValue(cmStrCat("Invalid Required ", name), value);
          break;
        case ObjectError::InvalidObject:
          state->AddErrorAtValue(cmStrCat("Invalid ", name), value);
          break;
        case ObjectError::ExtraField: {
          for (auto const& member : extraFields) {
            if (value) {
              state->AddErrorAtValue(
                cmStrCat("Invalid extra field \"", member, "\" in ", name),
                &(*value)[member]);
            } else {
              state->AddError(
                cmStrCat("Invalid extra field \"", member, "\" in ", name));
            }
          }
        } break;
        case ObjectError::MissingRequired:
          state->AddErrorAtValue(cmStrCat("Missing required field \"",
                                          state->key(), "\" in ", name),
                                 value);
          break;
      }
    };
  };
}